

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

uint32_t __thiscall
diligent_spirv_cross::CompilerGLSL::type_to_packed_base_size
          (CompilerGLSL *this,SPIRType *type,BufferPackingStandard param_2)

{
  CompilerError *this_00;
  BufferPackingStandard param_2_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  switch(type->basetype) {
  case SByte:
  case UByte:
    this_local._4_4_ = 1;
    break;
  case Short:
  case UShort:
  case Half:
    this_local._4_4_ = 2;
    break;
  case Int:
  case UInt:
  case Float:
    this_local._4_4_ = 4;
    break;
  case Int64:
  case UInt64:
  case Double:
    this_local._4_4_ = 8;
    break;
  default:
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Unrecognized type in type_to_packed_base_size.");
    __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  return this_local._4_4_;
}

Assistant:

uint32_t CompilerGLSL::type_to_packed_base_size(const SPIRType &type, BufferPackingStandard)
{
	switch (type.basetype)
	{
	case SPIRType::Double:
	case SPIRType::Int64:
	case SPIRType::UInt64:
		return 8;
	case SPIRType::Float:
	case SPIRType::Int:
	case SPIRType::UInt:
		return 4;
	case SPIRType::Half:
	case SPIRType::Short:
	case SPIRType::UShort:
		return 2;
	case SPIRType::SByte:
	case SPIRType::UByte:
		return 1;

	default:
		SPIRV_CROSS_THROW("Unrecognized type in type_to_packed_base_size.");
	}
}